

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall Matrix::FromArray(Matrix *this,double *data,int rows,int cols)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  Matrix MVar2;
  
  Matrix(this,rows,cols);
  uVar1 = extraout_RDX;
  if (cols * rows != 0) {
    memmove(this->data,data,(long)(cols * rows) << 3);
    uVar1 = extraout_RDX_00;
  }
  MVar2.rows = (int)uVar1;
  MVar2.cols = (int)((ulong)uVar1 >> 0x20);
  MVar2.data = (double *)this;
  return MVar2;
}

Assistant:

Matrix Matrix::FromArray(double* data, int rows, int cols)
{
    Matrix matrix(rows, cols);
    std::copy(data, data + rows * cols, matrix.data);

    return matrix;
}